

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

int lnextkey(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  node *pnVar4;
  int index;
  node *n;
  lua_Integer i_1;
  char *pcStack_48;
  int sizearray;
  char *str;
  size_t sz;
  int local_30;
  int keytype;
  int key;
  uint32_t keyhash;
  int kt;
  int i;
  table *tbl;
  lua_State *L_local;
  
  tbl = (table *)L;
  _kt = get_table(L,1);
  iVar1 = lua_type((lua_State *)tbl,2);
  if (iVar1 < 1) {
    if (0 < _kt->sizearray) {
      for (keyhash = 0; (int)keyhash < _kt->sizearray; keyhash = keyhash + 1) {
        if (_kt->arraytype[(int)keyhash] != '\0') {
          lua_pushinteger((lua_State *)tbl,(long)(int)(keyhash + 1));
          return 1;
        }
      }
    }
    iVar1 = pushfirsthash((lua_State *)tbl,_kt);
    return iVar1;
  }
  key = lua_type((lua_State *)tbl,2);
  local_30 = 0;
  str = (char *)0x0;
  pcStack_48 = (char *)0x0;
  iVar1 = _kt->sizearray;
  if (key == 3) {
    iVar2 = lua_isinteger((lua_State *)tbl,2);
    if (iVar2 == 0) {
      return 0;
    }
    lVar3 = lua_tointegerx((lua_State *)tbl,2,(int *)0x0);
    local_30 = (int)lVar3;
    if ((0 < local_30) && (local_30 <= iVar1)) {
      n = (node *)(long)local_30;
      while( true ) {
        if ((long)iVar1 <= (long)n) {
          iVar1 = pushfirsthash((lua_State *)tbl,_kt);
          return iVar1;
        }
        if (_kt->arraytype[(long)n] != '\0') break;
        n = (node *)((long)&n->v + 1);
      }
      lua_pushinteger((lua_State *)tbl,(lua_Integer)((long)&n->v + 1));
      return 1;
    }
    sz._4_4_ = 0;
    keytype = local_30;
  }
  else {
    pcStack_48 = luaL_checklstring((lua_State *)tbl,2,(size_t *)&str);
    keytype = calchash(pcStack_48,(size_t)str);
    sz._4_4_ = 1;
  }
  pnVar4 = lookup_key(_kt,keytype,local_30,sz._4_4_,pcStack_48,(size_t)str);
  if (pnVar4 == (node *)0x0) {
    L_local._4_4_ = 0;
  }
  else if ((int)(((long)(pnVar4 + 1) - (long)_kt->hash) / 0x18) == _kt->sizehash) {
    L_local._4_4_ = 0;
  }
  else {
    pushkey((lua_State *)tbl,_kt->L,pnVar4 + 1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int
lnextkey(lua_State *L) {
	struct table *tbl = get_table(L,1);
	if (lua_isnoneornil(L,2)) {
		if (tbl->sizearray > 0) {
			int i;
			for (i=0;i<tbl->sizearray;i++) {
				if (tbl->arraytype[i] != VALUETYPE_NIL) {
					lua_pushinteger(L, i+1);
					return 1;
				}
			}
		}
		return pushfirsthash(L, tbl);
	}
	int kt = lua_type(L,2);
	uint32_t keyhash;
	int key = 0;
	int keytype;
	size_t sz=0;
	const char *str = NULL;
	int sizearray = tbl->sizearray;
	if (kt == LUA_TNUMBER) {
		if (!lua_isinteger(L, 2)) {
			return 0;
		}
		key = (int)lua_tointeger(L, 2);
		if (key > 0 && key <= sizearray) {
			lua_Integer i;
			for (i=key;i<sizearray;i++) {
				if (tbl->arraytype[i] != VALUETYPE_NIL) {
					lua_pushinteger(L, i+1);
					return 1;
				}
			}
			return pushfirsthash(L, tbl);
		}
		keyhash = (uint32_t)key;
		keytype = KEYTYPE_INTEGER;
	} else {
		str = luaL_checklstring(L, 2, &sz);
		keyhash = calchash(str, sz);
		keytype = KEYTYPE_STRING;
	}

	struct node *n = lookup_key(tbl, keyhash, key, keytype, str, sz);
	if (n) {
		++n;
		int index = n-tbl->hash;
		if (index == tbl->sizehash) {
			return 0;
		}
		pushkey(L, tbl->L, n);
		return 1;
	} else {
		return 0;
	}
}